

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,StmtBlock *stmt)

{
  StatementBlockType SVar1;
  StmtBlock *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  SVar1 = StmtBlock::block_type(stmt);
  switch(SVar1) {
  case Combinational:
    stmt_code(this,(CombinationalStmtBlock *)stmt);
    break;
  case Sequential:
    stmt_code(this,(SequentialStmtBlock *)stmt);
    break;
  case Scope:
    stmt_code(this,(ScopedStmtBlock *)stmt);
    break;
  case Function:
    stmt_code(this,(FunctionStmtBlock *)stmt);
    break;
  case Initial:
    stmt_code(this,(InitialStmtBlock *)stmt);
    break;
  case Latch:
    stmt_code(this,(LatchStmtBlock *)stmt);
    break;
  case Final:
    stmt_code(this,(FinalStmtBlock *)stmt);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(StmtBlock* stmt) {
    switch (stmt->block_type()) {
        case StatementBlockType::Sequential: {
            stmt_code(reinterpret_cast<SequentialStmtBlock*>(stmt));
            break;
        }
        case StatementBlockType::Combinational: {
            stmt_code(reinterpret_cast<CombinationalStmtBlock*>(stmt));
            break;
        }
        case StatementBlockType::Scope: {
            stmt_code(reinterpret_cast<ScopedStmtBlock*>(stmt));
            break;
        }
        case StatementBlockType::Function: {
            stmt_code(reinterpret_cast<FunctionStmtBlock*>(stmt));
            break;
        }
        case StatementBlockType::Initial: {
            stmt_code(reinterpret_cast<InitialStmtBlock*>(stmt));
            break;
        }
        case StatementBlockType::Final: {
            stmt_code(reinterpret_cast<FinalStmtBlock*>(stmt));
            break;
        }
        case StatementBlockType::Latch: {
            stmt_code(reinterpret_cast<LatchStmtBlock*>(stmt));
            break;
        }
    }
}